

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * Strsafe(char *y)

{
  char *dest;
  size_t sVar1;
  
  if (y == (char *)0x0) {
    dest = (char *)0x0;
  }
  else {
    dest = Strsafe_find(y);
    if (dest == (char *)0x0) {
      sVar1 = strlen(y);
      dest = (char *)malloc((long)((int)sVar1 + 1));
      if (dest == (char *)0x0) {
        memory_error();
      }
      lemon_strcpy(dest,y);
      Strsafe_insert(dest);
    }
  }
  return dest;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    lemon_strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}